

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void wipe_mon_list(chunk *c,player *p)

{
  long lVar1;
  loc_conflict grid;
  _Bool _Var2;
  monster_conflict *__s;
  monster_lore_conflict *pmVar3;
  chunk *local_58;
  object *local_48;
  monster_lore *lore;
  object *obj;
  object *held_obj;
  monster *mon;
  wchar_t i;
  wchar_t m_idx;
  player *p_local;
  chunk *c_local;
  
  mon._4_4_ = cave_monster_max((chunk_conflict *)c);
  while (mon._4_4_ = mon._4_4_ + L'\xffffffff', L'\0' < mon._4_4_) {
    __s = cave_monster((chunk_conflict *)c,mon._4_4_);
    if (__s == (monster_conflict *)0x0) {
      local_48 = (object *)0x0;
    }
    else {
      local_48 = __s->held_obj;
    }
    if (__s->race != (monster_race *)0x0) {
      if (local_48 != (object *)0x0) {
        for (lore = (monster_lore *)local_48; lore != (monster_lore *)0x0;
            lore = *(monster_lore **)lore->flags) {
          lVar1._0_1_ = lore->drop_gold;
          lVar1._1_1_ = lore->drop_item;
          lVar1._2_1_ = lore->cast_innate;
          lVar1._3_1_ = lore->cast_spell;
          lVar1._4_4_ = *(undefined4 *)&lore->field_0x14;
          if ((lVar1 != 0) && (_Var2 = obj_is_known_artifact((object *)lore), !_Var2)) {
            mark_artifact_created(*(artifact **)&lore->drop_gold,false);
          }
          if (*(short *)(lore->spell_flags + 4) != 0) {
            c->objects[*(ushort *)(lore->spell_flags + 4)] = (object *)0x0;
          }
        }
        if ((p == (player *)0x0) || (c != (chunk *)cave)) {
          local_58 = (chunk *)0x0;
        }
        else {
          local_58 = (chunk *)p->cave;
        }
        object_pile_free(c,local_58,local_48);
      }
      if (__s->original_race == (monster_race *)0x0) {
        __s->race->cur_num = __s->race->cur_num + L'\xffffffff';
      }
      else {
        __s->original_race->cur_num = __s->original_race->cur_num + L'\xffffffff';
      }
      grid.x = (__s->grid).x;
      grid.y = (__s->grid).y;
      square_set_mon(c,grid,L'\0');
      _Var2 = flag_has_dbg(__s->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
      if (_Var2) {
        pmVar3 = get_lore(__s->race);
        pmVar3->sights = 0;
        pmVar3->deaths = 0;
        pmVar3->pkills = 0;
        pmVar3->tkills = 0;
        c->ghost->bones_selector = L'\0';
        c->ghost->has_spoken = false;
        my_strcpy(c->ghost->name,"",0x50);
        my_strcpy(c->ghost->string,"",0x50);
        c->ghost->string_type = L'\0';
        if (player->upkeep->monster_race == __s->race) {
          player->upkeep->monster_race = (monster_race *)0x0;
        }
      }
      memset(__s,0,0x1f0);
    }
  }
  mem_free(r_info[(int)(z_info->r_max - 1)].blow);
  memset(r_info + (int)(z_info->r_max - 1),0,0xd0);
  for (mon._0_4_ = 1; (int)mon < (int)(uint)z_info->level_monster_max; mon._0_4_ = (int)mon + 1) {
    if (c->monster_groups[(int)mon] != (monster_group_conflict *)0x0) {
      monster_group_free(c,c->monster_groups[(int)mon]);
    }
  }
  c->mon_max = 1;
  c->mon_cnt = 0;
  c->num_repro = L'\0';
  target_set_monster((monster *)0x0);
  health_track(p->upkeep,(monster *)0x0);
  return;
}

Assistant:

void wipe_mon_list(struct chunk *c, struct player *p)
{
	int m_idx, i;

	/* Delete all the monsters */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);
		struct object *held_obj = mon ? mon->held_obj : NULL;

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Delete all the objects */
		if (held_obj) {
			/* Go through all held objects and check for artifacts */
			struct object *obj = held_obj;
			while (obj) {
				if (obj->artifact && !obj_is_known_artifact(obj)) {
					mark_artifact_created(obj->artifact,
						false);
				}
				/*
				 * Also, remove from the cave's object list.
				 * That way, the scan for orphaned objects
				 * in cave_free() doesn't attempt to
				 * access freed memory or free memory
				 * twice.
				 */
				if (obj->oidx) {
					c->objects[obj->oidx] = NULL;
				}
				obj = obj->next;
			}
			object_pile_free(c, (p && c == cave) ? p->cave : NULL,
				held_obj);
		}

		/* Reduce the racial counter */
		if (mon->original_race) mon->original_race->cur_num--;
		else mon->race->cur_num--;

		/* Monster is gone from square */
		square_set_mon(c, mon->grid, 0);

		/* If the monster was a player ghost, remove it from the monster memory,
		 * ensure that it never appears again, clear its data and allow the
		 * next ghost to speak. */
		if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
			struct monster_lore *lore = get_lore(mon->race);
			lore->sights = 0;
			lore->deaths = 0;
			lore->pkills = 0;
			lore->tkills = 0;
			c->ghost->bones_selector = 0;
			c->ghost->has_spoken = false;
			my_strcpy(c->ghost->name, "", sizeof(c->ghost->name));
			my_strcpy(c->ghost->string, "", sizeof(c->ghost->string));
			c->ghost->string_type = 0;
			if (player->upkeep->monster_race == mon->race) {
				player->upkeep->monster_race = NULL;
			}
		}

		/* Wipe the Monster */
		memset(mon, 0, sizeof(struct monster));
	}

	/* Delete the player ghost record completely */
	mem_free(r_info[PLAYER_GHOST_RACE].blow);
	memset(&r_info[PLAYER_GHOST_RACE], 0, sizeof(struct monster_race));

	/* Delete all the monster groups */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			monster_group_free(c, c->monster_groups[i]);
		}
	}

	/* Reset "cave->mon_max" */
	c->mon_max = 1;

	/* Reset "mon_cnt" */
	c->mon_cnt = 0;

	/* Reset "reproducer" count */
	c->num_repro = 0;

	/* Hack -- no more target */
	target_set_monster(0);

	/* Hack -- no more tracking */
	health_track(p->upkeep, 0);
}